

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cecSplit.c
# Opt level: O3

Abc_Cex_t * Cec_SplitDeriveModel(Gia_Man_t *p,Cnf_Dat_t *pCnf,sat_solver *pSat)

{
  int iVar1;
  int iVar2;
  uint uVar3;
  Vec_Int_t *pVVar4;
  int *piVar5;
  int nPis;
  int *pArray;
  long lVar6;
  Abc_Cex_t *pAVar7;
  ulong uVar8;
  
  pVVar4 = p->vCis;
  iVar1 = pVVar4->nSize;
  iVar2 = p->nRegs;
  nPis = iVar1 - iVar2;
  pArray = (int *)calloc((long)nPis,4);
  if (iVar2 < iVar1) {
    lVar6 = 0;
    do {
      if (iVar1 <= lVar6) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                      ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
      }
      iVar2 = pVVar4->pArray[lVar6];
      if (((long)iVar2 < 0) || (p->nObjs <= iVar2)) {
        __assert_fail("v >= 0 && v < p->nObjs",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/gia.h"
                      ,0x1d1,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
      }
      if (p->pObjs == (Gia_Obj_t *)0x0) break;
      iVar2 = pCnf->pVarNums[iVar2];
      if (((long)iVar2 < 0) || (pSat->size <= iVar2)) {
        __assert_fail("v >= 0 && v < s->size",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/sat/bsat/satSolver.h"
                      ,0xda,"int sat_solver_var_value(sat_solver *, int)");
      }
      pArray[lVar6] = (uint)(pSat->model[iVar2] == 1);
      lVar6 = lVar6 + 1;
    } while (lVar6 < nPis);
  }
  pVVar4 = p->vCofVars;
  if ((pVVar4 == (Vec_Int_t *)0x0) || (iVar1 = pVVar4->nSize, (long)iVar1 < 1)) {
    pAVar7 = Abc_CexCreate(0,nPis,pArray,0,0,0);
    if (pArray == (int *)0x0) {
      return pAVar7;
    }
  }
  else {
    piVar5 = pVVar4->pArray;
    uVar8 = 0;
    do {
      uVar3 = piVar5[uVar8];
      if ((int)uVar3 < 0) {
        __assert_fail("Lit >= 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/util/abc_global.h"
                      ,0x130,"int Abc_LitIsCompl(int)");
      }
      pArray[uVar3 >> 1] = ~uVar3 & 1;
      uVar8 = uVar8 + 1;
    } while (uVar8 < (ulong)(long)iVar1);
    pAVar7 = Abc_CexCreate(0,nPis,pArray,0,0,0);
  }
  free(pArray);
  return pAVar7;
}

Assistant:

Abc_Cex_t * Cec_SplitDeriveModel( Gia_Man_t * p, Cnf_Dat_t * pCnf, sat_solver * pSat )
{
    Abc_Cex_t * pCex;
    Gia_Obj_t * pObj;
    int i, iLit, * pModel;
    pModel = ABC_CALLOC( int, Gia_ManPiNum(p) );
    Gia_ManForEachPi( p, pObj, i )
        pModel[i] = sat_solver_var_value(pSat, pCnf->pVarNums[Gia_ObjId(p, pObj)]);
    if ( p->vCofVars )
        Vec_IntForEachEntry( p->vCofVars, iLit, i )
            pModel[Abc_Lit2Var(iLit)] = !Abc_LitIsCompl(iLit);
    pCex = Abc_CexCreate( 0, Gia_ManPiNum(p), pModel, 0, 0, 0 );
    ABC_FREE( pModel );
    return pCex;
}